

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evenOdd.cpp
# Opt level: O0

int main(void)

{
  long lVar1;
  int *piVar2;
  allocator<char> *__a;
  int iVar3;
  undefined4 uVar4;
  ostream *poVar5;
  undefined8 uStack_290;
  ostream *local_288;
  ostream *local_280;
  int *local_278;
  ostream *local_270;
  ostream *local_268;
  allocator<char> *local_260;
  int *local_258;
  allocator<char> *local_250;
  int local_244;
  undefined1 local_240 [4];
  int difference;
  ostringstream local_220 [8];
  ostringstream promptStream;
  allocator<char> local_a1;
  string local_a0 [8];
  string prompt_1;
  int x;
  unsigned_long __vla_expr0;
  string local_68;
  allocator<char> local_31;
  string local_30 [8];
  string prompt;
  int size;
  
  prompt.field_2._12_4_ = 0;
  local_250 = &local_31;
  uStack_290 = 0x102522;
  std::allocator<char>::allocator();
  uStack_290 = 0x102539;
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"Please enter an array size: ",local_250);
  uStack_290 = 0x102544;
  std::allocator<char>::~allocator(&local_31);
  uStack_290 = 0x102551;
  std::__cxx11::string::string((string *)&local_68,local_30);
  uStack_290 = 0x102560;
  getInt((int *)(prompt.field_2._M_local_buf + 8),&local_68);
  uStack_290 = 0x10256b;
  std::__cxx11::string::~string((string *)&local_68);
  lVar1 = -((ulong)(uint)prompt.field_2._8_4_ * 4 + 0xf & 0xfffffffffffffff0);
  local_258 = (int *)((long)&local_288 + lVar1);
  for (prompt_1.field_2._12_4_ = 0; piVar2 = local_258,
      (int)prompt_1.field_2._12_4_ < (int)prompt.field_2._8_4_;
      prompt_1.field_2._12_4_ = prompt_1.field_2._12_4_ + 1) {
    local_260 = &local_a1;
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x1025bb;
    std::allocator<char>::allocator();
    __a = local_260;
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x1025d5;
    std::__cxx11::string::string<std::allocator<char>>
              (local_a0,"Please enter the value of element ",__a);
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x1025e3;
    std::allocator<char>::~allocator(&local_a1);
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x1025ef;
    std::__cxx11::ostringstream::ostringstream(local_220);
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x102604;
    poVar5 = std::operator<<((ostream *)local_220,local_a0);
    uVar4 = prompt_1.field_2._12_4_;
    local_268 = poVar5;
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x10261c;
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar4);
    local_270 = poVar5;
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x102638;
    std::operator<<(poVar5,": ");
    local_278 = local_258 + (int)prompt_1.field_2._12_4_;
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x102663;
    std::__cxx11::ostringstream::str();
    piVar2 = local_278;
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x102678;
    getInt(piVar2,(string *)local_240);
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x102686;
    std::__cxx11::string::~string((string *)local_240);
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x102692;
    std::__cxx11::ostringstream::~ostringstream(local_220);
    *(undefined8 *)((long)&uStack_290 + lVar1) = 0x10269e;
    std::__cxx11::string::~string(local_a0);
  }
  *(undefined8 *)((long)&uStack_290 + lVar1) = 0x10276e;
  local_244 = calculateEvenOddDifference(piVar2,prompt.field_2._8_4_);
  *(undefined8 *)((long)&uStack_290 + lVar1) = 0x102787;
  poVar5 = std::operator<<((ostream *)&std::cout,
                           "The difference of the even numbers and odd numbers is: ");
  iVar3 = local_244;
  local_280 = poVar5;
  *(undefined8 *)((long)&uStack_290 + lVar1) = 0x1027a2;
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar3);
  local_288 = poVar5;
  *(undefined8 *)((long)&uStack_290 + lVar1) = 0x1027be;
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  prompt.field_2._12_4_ = 0;
  uStack_290 = 0x1027d7;
  std::__cxx11::string::~string(local_30);
  return prompt.field_2._12_4_;
}

Assistant:

int main()
{
    int size;

    string prompt = "Please enter an array size: ";
    getInt(&size, prompt);

    int calcArray [size];
    for(int x = 0; x < size; x++)
    {
        //let's use a stream to combine a string and an int
        string prompt = "Please enter the value of element ";
        ostringstream promptStream;
        promptStream << prompt << x << ": ";

        // this function places the string value into our array
        getInt(&calcArray[x], promptStream.str());

    }

    //blah blah... long function name.... wheeeeeeeeee
    int difference = calculateEvenOddDifference(calcArray, size);

    cout << "The difference of the even numbers and odd numbers is: " << difference << endl;

    return 0;
}